

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugins.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Plugins::del
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Plugins *this,Path *type,Path *name)

{
  Client *client;
  string local_a8;
  string local_88;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Url local_48;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  Path *name_local;
  Path *type_local;
  Plugins *this_local;
  
  client = *(Client **)this;
  local_28 = name;
  name_local = type;
  type_local = (Path *)this;
  this_local = (Plugins *)__return_storage_ptr__;
  Vault::operator+(&local_a8,type,"/");
  Vault::operator+(&local_88,&local_a8,local_28);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_68,&local_88);
  getUrl(&local_48,this,&local_68);
  HttpConsumer::del(__return_storage_ptr__,client,&local_48);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Plugins::del(const Path &type,
                                                    const Path &name) {
  return HttpConsumer::del(client_, getUrl(Path{type + "/" + name}));
}